

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# case.c
# Opt level: O0

int XUtf8Toupper(int ucs)

{
  int iVar1;
  int local_14;
  int l;
  int i;
  int ucs_local;
  
  if (XUtf8Toupper::table == (unsigned_short *)0x0) {
    XUtf8Toupper::table = (unsigned_short *)malloc(0x20000);
    for (local_14 = 0; local_14 < 0x10000; local_14 = local_14 + 1) {
      XUtf8Toupper::table[local_14] = (unsigned_short)local_14;
    }
    for (local_14 = 0; local_14 < 0x10000; local_14 = local_14 + 1) {
      iVar1 = XUtf8Tolower(local_14);
      if (iVar1 != local_14) {
        XUtf8Toupper::table[iVar1] = (unsigned_short)local_14;
      }
    }
  }
  i = ucs;
  if ((ucs < 0x10000) && (-1 < ucs)) {
    i = (int)XUtf8Toupper::table[ucs];
  }
  return i;
}

Assistant:

int 
XUtf8Toupper(int ucs) {
  int i;
  static unsigned short *table = NULL;

  if (!table) {
    table = (unsigned short*) malloc(sizeof(unsigned short) * 0x10000);
    for (i = 0; i < 0x10000; i++) {
      table[i] = (unsigned short) i;
    }
    for (i = 0; i < 0x10000; i++) {
      int l;
      l = XUtf8Tolower(i);
      if (l != i) table[l] = (unsigned short) i;
    }
  }
  if (ucs >= 0x10000 || ucs < 0) return ucs;
  return table[ucs];
}